

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_delay_2.h
# Opt level: O2

void __thiscall PlayerDelay_2::~PlayerDelay_2(PlayerDelay_2 *this)

{
  Player::~Player(&this->super_Player);
  operator_delete(this);
  return;
}

Assistant:

PlayerDelay_2 (const std::string& name) :
        Player(name)
        {}